

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationSurfaceOccurrence::IfcAnnotationSurfaceOccurrence
          (IfcAnnotationSurfaceOccurrence *this)

{
  *(undefined ***)&(this->super_IfcAnnotationOccurrence).field_0x90 = &PTR__Object_008f50b0;
  *(undefined8 *)&this->field_0x98 = 0;
  *(char **)&this->field_0xa0 = "IfcAnnotationSurfaceOccurrence";
  IfcStyledItem::IfcStyledItem((IfcStyledItem *)this,&PTR_construction_vtable_24__009a2f28);
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem = 0x9a2e68;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).field_0x90 = 0x9a2f08;
  (this->super_IfcAnnotationOccurrence).super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x9a2e90;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x70 = 0x9a2eb8;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x80 = 0x9a2ee0;
  return;
}

Assistant:

IfcAnnotationSurfaceOccurrence() : Object("IfcAnnotationSurfaceOccurrence") {}